

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS
ref_search_selection(REF_MPI ref_mpi,REF_INT n,REF_DBL *elements,REF_LONG position,REF_DBL *value)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  REF_DBL local_68;
  REF_DBL local_60;
  REF_DBL local_58;
  REF_LONG count;
  ulong local_48;
  REF_LONG high_pos;
  REF_DBL temp;
  
  high_pos = (REF_LONG)n;
  uVar2 = ref_mpi_allsum(ref_mpi,&high_pos,1,2);
  if (uVar2 == 0) {
    high_pos = high_pos + -1;
    uVar3 = 0;
    if (n < 1) {
      n = 0;
    }
    local_60 = 1e+200;
    local_68 = -1e+200;
    for (; (uint)n != uVar3; uVar3 = uVar3 + 1) {
      dVar1 = elements[uVar3];
      if (dVar1 <= local_60) {
        local_60 = dVar1;
      }
      if (local_68 <= dVar1) {
        local_68 = dVar1;
      }
    }
    local_58 = local_68;
    temp = local_60;
    uVar2 = ref_mpi_min(ref_mpi,&temp,&local_60,3);
    if (uVar2 == 0) {
      uVar2 = ref_mpi_bcast(ref_mpi,&local_60,1,3);
      if (uVar2 == 0) {
        temp = local_58;
        uVar2 = ref_mpi_max(ref_mpi,&temp,&local_68,3);
        if (uVar2 == 0) {
          uVar2 = ref_mpi_bcast(ref_mpi,&local_68,1,3);
          if (uVar2 == 0) {
            local_58 = local_60;
            if ((0 < position) && (local_58 = local_68, position < high_pos)) {
              local_58 = (local_60 + local_68) * 0.5;
              uVar2 = 0;
              while (local_48 = (ulong)uVar2, uVar2 != 0x28) {
                count = 0;
                local_58 = (local_60 + local_68) * 0.5;
                lVar4 = 0;
                for (uVar3 = 0; (uint)n != uVar3; uVar3 = uVar3 + 1) {
                  if (elements[uVar3] <= local_58) {
                    lVar4 = lVar4 + 1;
                    count = lVar4;
                  }
                }
                uVar2 = ref_mpi_allsum(ref_mpi,&count,1,2);
                if (uVar2 != 0) {
                  pcVar6 = "bcast";
                  uVar5 = 0x1bc;
                  goto LAB_001b0010;
                }
                if (position < count) {
                  local_68 = local_58;
                }
                else {
                  local_60 = local_58;
                }
                uVar2 = (int)local_48 + 1;
              }
            }
            *value = local_58;
            return 0;
          }
          pcVar6 = "bcast";
          uVar5 = 0x1a8;
        }
        else {
          pcVar6 = "max";
          uVar5 = 0x1a7;
        }
      }
      else {
        pcVar6 = "bcast";
        uVar5 = 0x1a5;
      }
    }
    else {
      pcVar6 = "min";
      uVar5 = 0x1a4;
    }
  }
  else {
    pcVar6 = "high_pos";
    uVar5 = 0x19b;
  }
LAB_001b0010:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar5,
         "ref_search_selection",(ulong)uVar2,pcVar6);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_search_selection(REF_MPI ref_mpi, REF_INT n,
                                        REF_DBL *elements, REF_LONG position,
                                        REF_DBL *value) {
  REF_INT i, bisection;
  REF_LONG low_pos, high_pos, count;
  REF_DBL low_val, high_val, temp, mid_val;
  low_pos = 0;
  high_pos = (REF_LONG)n;
  RSS(ref_mpi_allsum(ref_mpi, &high_pos, 1, REF_LONG_TYPE), "high_pos");
  high_pos--;
  low_val = REF_DBL_MAX;
  high_val = REF_DBL_MIN;
  for (i = 0; i < n; i++) {
    low_val = MIN(low_val, elements[i]);
    high_val = MAX(high_val, elements[i]);
  }
  temp = low_val;
  RSS(ref_mpi_min(ref_mpi, &temp, &low_val, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, &low_val, 1, REF_DBL_TYPE), "bcast");
  temp = high_val;
  RSS(ref_mpi_max(ref_mpi, &temp, &high_val, REF_DBL_TYPE), "max");
  RSS(ref_mpi_bcast(ref_mpi, &high_val, 1, REF_DBL_TYPE), "bcast");

  if (position <= low_pos) {
    *value = low_val;
    return REF_SUCCESS;
  }

  if (position >= high_pos) {
    *value = high_val;
    return REF_SUCCESS;
  }

  mid_val = 0.5 * (low_val + high_val); /* ensure initialized */
  for (bisection = 0; bisection < 40; bisection++) {
    mid_val = 0.5 * (low_val + high_val);
    count = 0;
    for (i = 0; i < n; i++) {
      if (elements[i] <= mid_val) count++;
    }

    RSS(ref_mpi_allsum(ref_mpi, &count, 1, REF_LONG_TYPE), "bcast");
    /* printf("pos  %ld %ld %ld val %f %f %f\n",
               low_pos, count, high_pos, low_val,
               mid_val, high_val);*/
    if (count - 1 < position) {
      low_val = mid_val;
    } else {
      high_val = mid_val;
    }
  }
  *value = mid_val;
  return REF_SUCCESS;
}